

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue4f
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,float x,
               float y,float z,float w)

{
  ostringstream *this;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  StateQueryMemoryWriteGuard<float[4]> state;
  undefined1 local_1a8 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
            (&state);
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,state.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    (&state,testCtx);
  if ((bVar2) &&
     (auVar1._4_4_ = -(uint)(y != state.m_value[1]), auVar1._0_4_ = -(uint)(x != state.m_value[0]),
     auVar1._8_4_ = -(uint)(z != state.m_value[2]), auVar1._12_4_ = -(uint)(w != state.m_value[3]),
     iVar3 = movmskps((int)CONCAT71(extraout_var,bVar2),auVar1), iVar3 != 0)) {
    local_1a8._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"// ERROR: expected [");
    std::ostream::operator<<(this,x);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,y);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,z);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,w);
    std::operator<<((ostream *)this,"]; got [");
    std::ostream::operator<<(this,state.m_value[0]);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,state.m_value[1]);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,state.m_value[2]);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,state.m_value[3]);
    std::operator<<((ostream *)this,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue4f (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, float x, float y, float z, float w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y ||
		state[2] != z ||
		state[3] != w)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y << ", "
		<< z << ", "
		<< w
		<< "]; got ["
		<< state[0] << ", "
		<< state[1] << ", "
		<< state[2] << ", "
		<< state[3]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}